

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O0

void __thiscall fasttext::QuantMatrix::quantize(QuantMatrix *this,DenseMatrix *mat)

{
  real *codes;
  pointer pPVar1;
  ProductQuantizer *in_RDI;
  real *dataptr;
  Vector norms;
  real *in_stack_000000e0;
  int32_t in_stack_000000ec;
  ProductQuantizer *in_stack_000000f0;
  int64_t in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  Matrix *in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc8;
  QuantMatrix *in_stack_ffffffffffffffd0;
  Vector *in_stack_ffffffffffffffd8;
  DenseMatrix *in_stack_ffffffffffffffe0;
  int32_t n;
  
  if ((*(int64_t *)&in_RDI[1].max_points_per_cluster_ & 1) != 0) {
    Matrix::size(in_stack_ffffffffffffffb8,(int64_t)in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffb8 = (Matrix *)&stack0xffffffffffffffe0;
    Vector::Vector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    DenseMatrix::l2NormRow((DenseMatrix *)in_RDI,(Vector *)in_stack_ffffffffffffffb8);
    DenseMatrix::divideRow
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (int64_t)in_stack_ffffffffffffffd0,(int64_t)in_stack_ffffffffffffffc8);
    quantizeNorm(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Vector::~Vector((Vector *)0x1c15da);
  }
  codes = DenseMatrix::data((DenseMatrix *)0x1c1603);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
              *)0x1c1616);
  ProductQuantizer::train(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
  pPVar1 = std::
           unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           ::operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                         *)0x1c163c);
  n = (int32_t)((ulong)pPVar1 >> 0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c1658);
  ProductQuantizer::compute_codes(in_RDI,(real *)in_stack_ffffffffffffffb8,(uint8_t *)codes,n);
  return;
}

Assistant:

void QuantMatrix::quantize(DenseMatrix&& mat) {
  if (qnorm_) {
    Vector norms(mat.size(0));
    mat.l2NormRow(norms);
    mat.divideRow(norms);
    quantizeNorm(norms);
  }
  auto dataptr = mat.data();
  pq_->train(m_, dataptr);
  pq_->compute_codes(dataptr, codes_.data(), m_);
}